

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void liblogger::LogManager::Remove(shared_ptr<liblogger::ILogger> *Log)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 uVar3;
  string *in_RDI;
  size_t size;
  LogManagerScopedLock lock;
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
  *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffb7;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  LogManagerScopedLock::LogManagerScopedLock((LogManagerScopedLock *)in_stack_ffffffffffffff90);
  sVar1 = std::__cxx11::
          list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
          ::size(in_stack_ffffffffffffff90);
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>::
  remove((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
          *)m_loggers_abi_cxx11_,(char *)in_RDI);
  sVar2 = std::__cxx11::
          list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
          ::size(in_stack_ffffffffffffff90);
  if (sVar1 == sVar2) {
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    LogException::LogException
              ((LogException *)
               CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar4,in_stack_ffffffffffffffb0)),in_RDI)
    ;
    __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
  }
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1a377e);
  return;
}

Assistant:

void LogManager::Remove(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	size_t size = m_loggers.size();
	m_loggers.remove(Log);
	if (size == m_loggers.size())
		throw(LogException("LogManager::Remove cannot find logging module"));
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Removed Logger: %s", str.c_str());
#endif
}